

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

char * CVmObjBigNum::calc_asin_series(char *ext1,char *ext2,char *ext3,char *ext4,char *ext5)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  unsigned_long *in_RCX;
  unsigned_long in_RDX;
  char *in_RSI;
  unsigned_long *in_RDI;
  char *in_R8;
  char *in_stack_00000010;
  char *tmp;
  ulong i;
  ulong n;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc0;
  char *new_ext;
  undefined8 local_38;
  undefined8 local_30;
  unsigned_long *puVar4;
  undefined8 local_8;
  
  copy_val((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  compute_prod_into((char *)i,tmp,in_stack_00000010);
  local_30 = 1;
  local_8 = in_RDI;
  while( true ) {
    local_30 = local_30 + 2;
    puVar4 = in_RCX;
    get_one();
    copy_val((char *)in_stack_ffffffffffffffc0,(char *)in_RCX,in_stack_ffffffffffffffb4);
    new_ext = in_R8;
    in_stack_ffffffffffffffc0 = puVar4;
    in_R8 = in_RSI;
    for (local_38 = 3; local_38 < local_30; local_38 = local_38 + 2) {
      mul_by_long((char *)in_stack_ffffffffffffffc0,(unsigned_long)new_ext);
    }
    for (local_38 = 2; local_38 < local_30; local_38 = local_38 + 2) {
      div_by_long(in_R8,in_RDX,in_stack_ffffffffffffffc0);
    }
    div_by_long(in_R8,in_RDX,in_stack_ffffffffffffffc0);
    compute_prod_into((char *)i,tmp,in_stack_00000010);
    in_RSI = new_ext;
    compute_prod_into((char *)i,tmp,in_stack_00000010);
    iVar1 = is_zero(in_R8);
    if (iVar1 != 0) break;
    iVar1 = get_exp((char *)0x30e315);
    iVar2 = get_exp((char *)0x30e323);
    in_stack_ffffffffffffffb4 = iVar1 - iVar2;
    sVar3 = get_prec((char *)0x30e339);
    if ((int)sVar3 < in_stack_ffffffffffffffb4) {
      return (char *)local_8;
    }
    compute_sum_into(new_ext,(char *)in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffb4,iVar1));
    in_RCX = local_8;
    local_8 = in_stack_ffffffffffffffc0;
  }
  return (char *)local_8;
}

Assistant:

char *CVmObjBigNum::calc_asin_series(char *ext1, char *ext2,
                                     char *ext3, char *ext4, char *ext5)
{
    ulong n;

    /* get the current power of x (1) into the x power register, r2 */
    copy_val(ext2, ext1, FALSE);
    
    /* 
     *   compute x^2 into r3 - we'll multiply the previous power by this
     *   to get the next power (we need x^1, x^3, x^5, etc) 
     */
    compute_prod_into(ext3, ext1, ext1);

    /* start at the first term */
    n = 1;

    /* keep going until we have enough precision in the result */
    for (;;)
    {
        ulong i;
        char *tmp;
        
        /* move on to the next term */
        n += 2;
        
        /* 
         *   compute the next weirdness factor into r4:
         *   
         *    1*3*5*...*(n-2)
         *.  -----------------
         *.  2*4*6*...*(n-1)*n 
         */

        /* start out with 1 in r4 */
        copy_val(ext4, get_one(), FALSE);

        /* multiply by odd numbers up to but not including 'n' */
        for (i = 3 ; i < n ; i += 2)
            mul_by_long(ext4, i);
        
        /* 
         *   Divide by even numbers up to and including n-1.  Note that we
         *   use div_by_long() because it's faster than using a BigNumber
         *   divisor.  div_by_long() has a limit of ULONG_MAX/10 for the
         *   divisor; we shouldn't have to worry about exceeding that, since
         *   our maximum precision is 64k digits.  The series will converge
         *   to our maximum precision long before 'i' gets close to
         *   ULONG_MAX/10.  (Even if not, computing billions of series terms
         *   would take so long that we'd never get there anyway.)  
         */
        for (i = 2 ; i < n ; i += 2)
            div_by_long(ext4, i);
        
        /* divide by n */
        div_by_long(ext4, n);
        
        /* 
         *   compute the next power of x - multiply our current power of x
         *   (r2) by x^2 (r3) 
         */
        compute_prod_into(ext5, ext2, ext3);
        
        /* swap r5 into r2 - this new power of x is now current */
        tmp = ext5;
        ext5 = ext2;
        ext2 = tmp;
        
        /* 
         *   multiply the current x power by the current weirdness factor
         *   - this will yield the current term into r5 
         */
        compute_prod_into(ext5, ext2, ext4);

        /* 
         *   if this value is too small to show up in our accumulator,
         *   we're done 
         */
        if (is_zero(ext5)
            || get_exp(ext1) - get_exp(ext5) > (int)get_prec(ext1))
            break;

        /* 
         *   we can trash the weird factor now - use it as a scratch pad
         *   for adding the accumulator so far (r1) to this term 
         */
        compute_sum_into(ext4, ext1, ext5);

        /* swap the result into r1, since it's the new accumulator */
        tmp = ext4;
        ext4 = ext1;
        ext1 = tmp;
    }

    /* return the accumulator register */
    return ext1;
}